

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_graph_utilities.cpp
# Opt level: O3

void __thiscall
test_graph_utilities_pseudo_peripheral_vertex_Test::TestBody
          (test_graph_utilities_pseudo_peripheral_vertex_Test *this)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  undefined1 auVar6 [8];
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  DeathTest *gtest_dt;
  Adjacency_Graph<false> graph_saad;
  AssertHelper local_278;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_270;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_268;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_250;
  Adjacency_Graph<false> local_238;
  undefined1 local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  pointer local_1f8;
  pointer puStack_1f0;
  pointer local_1e8;
  pointer puStack_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_208 = (undefined1  [8])0x0;
  _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000006;
  local_1f8 = (pointer)0x0;
  puStack_1f0 = (pointer)0x8;
  local_1e8 = (pointer)0x1;
  puStack_1e0 = (pointer)0x7;
  local_1d8 = 1;
  local_1d0 = 8;
  local_1c8 = 1;
  local_1c0 = 10;
  local_1b8 = 1;
  local_1b0 = 0xc;
  local_1a8 = 2;
  local_1a0 = 6;
  local_198 = 2;
  local_190 = 7;
  local_188 = 2;
  local_180 = 9;
  local_178 = 3;
  local_170 = 0xb;
  local_168 = 3;
  local_160 = 0xc;
  local_158 = 3;
  local_150 = 0xe;
  local_148 = 4;
  local_140 = 9;
  local_138 = 4;
  local_130 = 10;
  local_128 = 4;
  local_120 = 0xb;
  local_118 = 4;
  local_110 = 0xd;
  local_108 = 5;
  local_100 = 0xd;
  local_f8 = 5;
  local_f0 = 0xe;
  local_e8 = 6;
  local_e0 = 7;
  local_d8 = 6;
  local_d0 = 8;
  local_c8 = 7;
  local_c0 = 8;
  local_b8 = 7;
  local_b0 = 9;
  local_a8 = 7;
  local_a0 = 10;
  local_98 = 9;
  local_90 = 10;
  local_88 = 10;
  local_80 = 0xb;
  local_78 = 10;
  local_70 = 0xc;
  local_68 = 0xb;
  local_60 = 0xc;
  local_58 = 0xb;
  local_50 = 0xd;
  local_48 = 0xb;
  local_40 = 0xe;
  local_38 = 0xd;
  local_30 = 0xe;
  edge_graph._M_len = 0x1e;
  edge_graph._M_array = (iterator)local_208;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(&local_238,edge_graph);
  local_270._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_238,0xb);
  local_278.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_208,"pseudo_peripheral_vertex(graph_saad, 11)","5",
             (unsigned_long *)&local_270,(int *)&local_278);
  if (local_208[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_270);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(_Stack_200._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x76,pcVar5);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_270._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_200._M_pi);
  }
  local_270._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_238,2);
  local_278.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_208,"pseudo_peripheral_vertex(graph_saad, 2)","0",
             (unsigned_long *)&local_270,(int *)&local_278);
  if (local_208[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_270);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(_Stack_200._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x77,pcVar5);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_270._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_200._M_pi);
  }
  local_208 = (undefined1  [8])0x0;
  _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_0000000f;
  Disa::Adjacency_Graph<false>::insert(&local_238,(Edge *)local_208);
  local_270._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_238,5);
  local_278.data_._0_4_ = 0xf;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_208,"pseudo_peripheral_vertex(graph_saad, 5)","15",
             (unsigned_long *)&local_270,(int *)&local_278);
  if (local_208[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_270);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(_Stack_200._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x7b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_270._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_200._M_pi);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_270._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1491ee;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_208,
               (testing *)&local_270,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_250,(PolymorphicMatcher *)local_208);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("pseudo_peripheral_vertex(Adjacency_Graph<false>())",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_250,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
                       ,0x7e,(DeathTest **)&local_278);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_250);
    if (!bVar2) goto LAB_0010e48a;
    auVar6 = (undefined1  [8])CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_);
    if (auVar6 != (undefined1  [8])0x0) {
      iVar4 = (**(code **)(((element_type *)auVar6)->pattern_ + 0x10))(auVar6);
      if (iVar4 == 0) {
        plVar1 = (long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_);
        iVar4 = (**(code **)(*plVar1 + 0x18))(plVar1);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(((element_type *)auVar6)->pattern_ + 8))(auVar6);
          goto LAB_0010e48a;
        }
      }
      else if (iVar4 == 1) {
        plVar1 = (long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_);
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_1e8 = (pointer)0x0;
          puStack_1e0 = (pointer)0x0;
          local_1f8 = (pointer)0x0;
          puStack_1f0 = (pointer)0x0;
          local_208 = (undefined1  [8])0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>
                    ((Adjacency_Graph<false> *)local_208,0);
          Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_208);
        }
        (**(code **)(*(long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_) + 0x28))
                  ((long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_),2);
        (**(code **)(*plVar1 + 0x28))(plVar1,0);
      }
      pcVar5 = ((element_type *)auVar6)->pattern_;
      goto LAB_0010e4dd;
    }
  }
  else {
LAB_0010e48a:
    testing::Message::Message((Message *)local_208);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x7e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
    if (local_208 != (undefined1  [8])0x0) {
      pcVar5 = *(char **)local_208;
      auVar6 = local_208;
LAB_0010e4dd:
      (**(code **)(pcVar5 + 8))(auVar6);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_270._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1491ee;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_208,
               (testing *)&local_270,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_268,(PolymorphicMatcher *)local_208);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_200._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("pseudo_peripheral_vertex(graph_saad, 16)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_268,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
                       ,0x7f,(DeathTest **)&local_278);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_268);
    if (!bVar2) goto LAB_0010e5e4;
    auVar6 = (undefined1  [8])CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_);
    if (auVar6 == (undefined1  [8])0x0) goto LAB_0010e63a;
    iVar4 = (**(code **)(((element_type *)auVar6)->pattern_ + 0x10))(auVar6);
    if (iVar4 == 0) {
      plVar1 = (long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_);
      iVar4 = (**(code **)(*plVar1 + 0x18))(plVar1);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(((element_type *)auVar6)->pattern_ + 8))(auVar6);
        goto LAB_0010e5e4;
      }
    }
    else if (iVar4 == 1) {
      plVar1 = (long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_238,0x10);
      }
      (**(code **)(*(long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_) + 0x28))
                ((long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_),2);
      (**(code **)(*plVar1 + 0x28))(plVar1,0);
    }
    pcVar5 = ((element_type *)auVar6)->pattern_;
  }
  else {
LAB_0010e5e4:
    testing::Message::Message((Message *)local_208);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x7f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
    if (local_208 == (undefined1  [8])0x0) goto LAB_0010e63a;
    pcVar5 = *(char **)local_208;
    auVar6 = local_208;
  }
  (**(code **)(pcVar5 + 8))(auVar6);
LAB_0010e63a:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_238);
  return;
}

Assistant:

TEST(test_graph_utilities, pseudo_peripheral_vertex) {

  Adjacency_Graph graph_saad = create_graph_saad();

  // Check to get the end vertices.
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 11), 5);
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 2), 0);

  // Insert a new edge, then search from the otheside of the graph, this should be the new peripheral vertex.
  graph_saad.insert({0, 15});
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 5), 15);

  // Death test.
  EXPECT_DEATH(pseudo_peripheral_vertex(Adjacency_Graph<false>()), "./*");
  EXPECT_DEATH(pseudo_peripheral_vertex(graph_saad, 16), "./*");
}